

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

char * bloaty::GetDataSourceLabel(DataSource source)

{
  long lVar1;
  long extraout_RAX;
  undefined4 *puVar2;
  undefined4 in_register_0000003c;
  
  lVar1 = 8;
  puVar2 = &data_sources;
  do {
    if (*(DataSource *)(&UNK_0061ffe8 + lVar1) == source) goto LAB_00184d5c;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xf8);
  GetDataSourceLabel((bloaty *)CONCAT44(in_register_0000003c,source));
  lVar1 = extraout_RAX;
LAB_00184d5c:
  return *(char **)(lVar1 + (long)puVar2);
}

Assistant:

const char* GetDataSourceLabel(DataSource source) {
  for (size_t i = 0; i < ARRAY_SIZE(data_sources); i++) {
    if (data_sources[i].number == source) {
      return data_sources[i].name;
    }
  }
  fprintf(stderr, "Unknown data source label: %d\n", static_cast<int>(source));
  exit(1);
  return nullptr;
}